

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void embree::storeImage(Ref<embree::Image> *img,FileName *fileName)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  runtime_error *this;
  string ext;
  FileName *in_stack_00000150;
  Ref<embree::Image> *in_stack_00000158;
  FileName *in_stack_000001f0;
  Ref<embree::Image> *in_stack_000001f8;
  FileName *in_stack_00000248;
  Ref<embree::Image> *in_stack_00000250;
  FileName *in_stack_00000278;
  Ref<embree::Image> *in_stack_00000280;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff48;
  FileName *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string local_50 [32];
  string local_30 [48];
  
  FileName::ext_abi_cxx11_(in_stack_ffffffffffffff78);
  toLowerCase(in_stack_ffffffffffffff88);
  std::__cxx11::string::~string(local_50);
  uVar1 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  if ((bool)uVar1) {
    storeSTB(in_stack_00000158,in_stack_00000150);
  }
  else {
    uVar2 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if ((bool)uVar2) {
      storeSTB(in_stack_00000158,in_stack_00000150);
    }
    else {
      uVar3 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if ((bool)uVar3) {
        storeSTB(in_stack_00000158,in_stack_00000150);
      }
      else {
        uVar4 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
        if ((bool)uVar4) {
          storeEXR((Ref<embree::Image> *)ext._M_string_length,(FileName *)ext._0_8_);
        }
        else {
          uVar5 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
          if ((bool)uVar5) {
            storePFM(in_stack_000001f8,in_stack_000001f0);
          }
          else {
            uVar6 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
            if ((bool)uVar6) {
              storePPM(in_stack_00000280,in_stack_00000278);
            }
            else {
              uVar7 = std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
              if (!(bool)uVar7) {
                this = (runtime_error *)__cxa_allocate_exception(0x10);
                std::operator+((char *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,CONCAT13(
                                                  uVar5,CONCAT12(uVar6,CONCAT11(uVar7,
                                                  in_stack_ffffffffffffff48))))))),(char *)this);
                std::runtime_error::runtime_error(this,(string *)&stack0xffffffffffffff80);
                __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
              }
              storeTga(in_stack_00000250,in_stack_00000248);
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void storeImage(const Ref<Image>& img, const FileName& fileName)
  {
    std::string ext = toLowerCase(fileName.ext());

    if (ext == "bmp" ) { storeSTB(img, fileName);  return; }
    if (ext == "png" ) { storeSTB(img, fileName);  return; }
    if (ext == "jpg" ) { storeSTB(img, fileName);  return; }

    if (ext == "exr" ) { storeEXR(img, fileName);  return; }

    if (ext == "pfm" ) { storePFM(img, fileName);  return; }
    if (ext == "ppm" ) { storePPM(img, fileName);  return; }
    if (ext == "tga" ) { storeTga(img, fileName);  return; }
    THROW_RUNTIME_ERROR("image format " + ext + " not supported");
  }